

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::NotLookingAt_<kj::parse::CharGroup_>::operator()
          (NotLookingAt_<kj::parse::CharGroup_> *this,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  IteratorInput<char,_const_char_*> *in_RDX;
  Tuple<> local_4f;
  undefined1 local_4e [22];
  IteratorInput<char,_const_char_*> subInput;
  IteratorInput<char,_const_char_*> *input_local;
  NotLookingAt_<kj::parse::CharGroup_> *this_local;
  
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_4e + 0xe),in_RDX);
  IteratorInput<char,_const_char_*>::forgetParent
            ((IteratorInput<char,_const_char_*> *)(local_4e + 0xe));
  CharGroup_::operator()((CharGroup_ *)local_4e,input);
  bVar1 = Maybe<char>::operator==((Maybe<char> *)local_4e,(void *)0x0);
  Maybe<char>::~Maybe((Maybe<char> *)local_4e);
  if (bVar1) {
    Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,&local_4f);
  }
  else {
    Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,(void *)0x0);
  }
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_4e + 0xe));
  return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
}

Assistant:

Maybe<Tuple<>> operator()(Input& input) const {
    Input subInput(input);
    subInput.forgetParent();
    if (subParser(subInput) == nullptr) {
      return Tuple<>();
    } else {
      return nullptr;
    }
  }